

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O2

ClientMetric * __thiscall
prometheus::Summary::Collect(ClientMetric *__return_storage_ptr__,Summary *this)

{
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  *this_00;
  pointer pQVar1;
  Quantile *quantile;
  pointer pQVar2;
  Quantile local_40;
  
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->counter).value = 0.0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label).
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->gauge).value = 0.0;
  (__return_storage_ptr__->info).value = 1.0;
  (__return_storage_ptr__->summary).sample_count = 0;
  (__return_storage_ptr__->summary).sample_sum = 0.0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->summary).quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->histogram).sample_count = 0;
  (__return_storage_ptr__->histogram).sample_sum = 0.0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->histogram).bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->untyped).value = 0.0;
  __return_storage_ptr__->timestamp_ms = 0;
  std::mutex::lock(&this->mutex_);
  this_00 = &(__return_storage_ptr__->summary).quantile;
  std::
  vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>::
  reserve(this_00,(long)(this->quantiles_).
                        super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->quantiles_).
                        super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5);
  pQVar1 = (this->quantiles_).
           super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pQVar2 = (this->quantiles_).
                super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                ._M_impl.super__Vector_impl_data._M_start; pQVar2 != pQVar1; pQVar2 = pQVar2 + 1) {
    local_40.value = 0.0;
    local_40.quantile = pQVar2->quantile;
    local_40.value = detail::TimeWindowQuantiles::get(&this->quantile_values_,local_40.quantile);
    std::
    vector<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
    ::emplace_back<prometheus::ClientMetric::Quantile>(this_00,&local_40);
  }
  (__return_storage_ptr__->summary).sample_count = this->count_;
  (__return_storage_ptr__->summary).sample_sum = this->sum_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return __return_storage_ptr__;
}

Assistant:

ClientMetric Summary::Collect() const {
  auto metric = ClientMetric{};

  std::lock_guard<std::mutex> lock(mutex_);

  metric.summary.quantile.reserve(quantiles_.size());
  for (const auto& quantile : quantiles_) {
    auto metricQuantile = ClientMetric::Quantile{};
    metricQuantile.quantile = quantile.quantile;
    metricQuantile.value = quantile_values_.get(quantile.quantile);
    metric.summary.quantile.push_back(std::move(metricQuantile));
  }
  metric.summary.sample_count = count_;
  metric.summary.sample_sum = sum_;

  return metric;
}